

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

size_t parseBackslash(StringRef Src,size_t I,SmallString<128U> *Token)

{
  char cVar1;
  bool bVar2;
  bool local_48;
  char local_46;
  bool local_45;
  int local_44;
  bool FollowedByDoubleQuote;
  SmallString<128U> *pSStack_40;
  int BackslashCount;
  size_t E;
  SmallString<128U> *Token_local;
  size_t I_local;
  StringRef Src_local;
  
  pSStack_40 = (SmallString<128U> *)Src.Length;
  I_local = (size_t)Src.Data;
  local_44 = 0;
  E = (size_t)Token;
  Token_local = (SmallString<128U> *)I;
  Src_local.Data = (char *)pSStack_40;
  do {
    Token_local = (SmallString<128U> *)
                  ((long)&(Token_local->super_SmallVector<char,_128U>).super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                  1);
    local_44 = local_44 + 1;
    bVar2 = false;
    if (Token_local != pSStack_40) {
      cVar1 = llvm::StringRef::operator[]((StringRef *)&I_local,(size_t)Token_local);
      bVar2 = cVar1 == '\\';
    }
  } while (bVar2);
  local_48 = false;
  if (Token_local != pSStack_40) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)&I_local,(size_t)Token_local);
    local_48 = cVar1 == '\"';
  }
  local_45 = local_48;
  if (local_48 == false) {
    llvm::SmallString<128U>::append((SmallString<128U> *)E,(long)local_44,'\\');
    Src_local.Length =
         (size_t)(Token_local[-1].super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>
                  .InlineElts + 0x7f);
  }
  else {
    llvm::SmallString<128U>::append((SmallString<128U> *)E,(long)(local_44 / 2),'\\');
    if (local_44 % 2 == 0) {
      Src_local.Length =
           (size_t)(Token_local[-1].super_SmallVector<char,_128U>.
                    super_SmallVectorStorage<char,_128U>.InlineElts + 0x7f);
    }
    else {
      local_46 = '\"';
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)E,&local_46);
      Src_local.Length = (size_t)Token_local;
    }
  }
  return Src_local.Length;
}

Assistant:

static size_t parseBackslash(StringRef Src, size_t I, SmallString<128> &Token) {
  size_t E = Src.size();
  int BackslashCount = 0;
  // Skip the backslashes.
  do {
    ++I;
    ++BackslashCount;
  } while (I != E && Src[I] == '\\');

  bool FollowedByDoubleQuote = (I != E && Src[I] == '"');
  if (FollowedByDoubleQuote) {
    Token.append(BackslashCount / 2, '\\');
    if (BackslashCount % 2 == 0)
      return I - 1;
    Token.push_back('"');
    return I;
  }
  Token.append(BackslashCount, '\\');
  return I - 1;
}